

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

Am_Value_List
toward_beginning(Am_Value_List *parts,Am_Value_List *old_value,bool to_home,bool extend)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List *this;
  ostream *poVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  Am_List_Item *extraout_RDX;
  char in_R8B;
  Am_Value_List *this_00;
  Am_Value_List AVar6;
  Am_Object object;
  Am_Value_List new_value;
  Am_Object local_58;
  undefined4 local_4c;
  Am_Value_List_Data *local_48;
  Am_Value_List local_40;
  
  this_00 = (Am_Value_List *)CONCAT71(in_register_00000011,to_home);
  this = &local_40;
  local_48 = (Am_Value_List_Data *)parts;
  Am_Value_List::Am_Value_List(this);
  local_58.data = (Am_Object_Data *)0x0;
  local_4c = (undefined4)CONCAT71(in_register_00000009,extend);
  if (extend && in_R8B == '\0') {
    Am_Value_List::Start(old_value);
    pAVar3 = Am_Value_List::Get(old_value);
    this = Am_Value_List::Add(&local_40,pAVar3,Am_TAIL,true);
  }
  else {
    bVar1 = Am_Value_List::Valid(this_00);
    if (bVar1) {
      Am_Value_List::End(old_value);
      iVar2 = -1;
      while (bVar1 = Am_Value_List::First(old_value), !bVar1) {
        pAVar3 = Am_Value_List::Get(old_value);
        Am_Object::operator=(&local_58,pAVar3);
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
        bVar1 = Am_Value_List::Start_Member(this_00,pAVar4);
        if (bVar1) {
          iVar2 = Am_Value_List::Nth(old_value);
        }
        Am_Value_List::Prev(old_value);
      }
      if (iVar2 == 0) {
        if ((char)local_4c == '\0') {
          this_00 = &Am_No_Value_List;
        }
        if (extend && in_R8B == '\0') {
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
          this_00 = Am_Value_List::Add(&local_40,pAVar4,Am_TAIL,true);
        }
        Am_Value_List::Am_Value_List((Am_Value_List *)local_48,this_00);
        goto LAB_00250386;
      }
      if (iVar2 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Lost old value ",0xf);
        poVar5 = operator<<((ostream *)&std::cerr,this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," from parts list for selection widget ",0x26);
        poVar5 = operator<<(poVar5,old_value);
        std::endl<char,std::char_traits<char>>(poVar5);
        Am_Error();
      }
      Am_Value_List::Move_Nth(old_value,iVar2 + -1);
      if (in_R8B != '\0') {
        this = &local_40;
        Am_Value_List::operator=(this,this_00);
        if ((char)local_4c != '\0') {
          while (bVar1 = Am_Value_List::First(old_value), !bVar1) {
            pAVar3 = Am_Value_List::Get(old_value);
            Am_Object::operator=(&local_58,pAVar3);
            pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
            Am_Value_List::Add(this,pAVar4,Am_TAIL,true);
            Am_Value_List::Prev(old_value);
          }
          goto LAB_00250379;
        }
      }
      pAVar3 = Am_Value_List::Get(old_value);
      this = &local_40;
      Am_Value_List::Add(this,pAVar3,Am_TAIL,true);
    }
    else {
      Am_Value_List::End(old_value);
      pAVar3 = Am_Value_List::Get(old_value);
      Am_Value_List::Add(this,pAVar3,Am_TAIL,true);
    }
  }
LAB_00250379:
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,this);
LAB_00250386:
  Am_Object::~Am_Object(&local_58);
  Am_Value_List::~Am_Value_List(&local_40);
  AVar6.item = extraout_RDX;
  AVar6.data = local_48;
  return AVar6;
}

Assistant:

Am_Value_List
toward_beginning(Am_Value_List &parts, Am_Value_List &old_value, bool to_home,
                 bool extend)
{
  Am_Value_List new_value;
  Am_Object object;
  if (!extend && to_home) { //the easy case
    parts.Start();
    return new_value.Add(parts.Get());
  }
  if (old_value.Valid()) {
    int index = -1;
    for (parts.End(); !parts.First(); parts.Prev()) {
      object = parts.Get();
      if (old_value.Start_Member(object))
        index = parts.Nth();
    }
    if (index == -1)
      Am_ERROR("Lost old value " << old_value
                                 << " from parts list for selection widget "
                                 << parts);
    if (index == 0) {
      if (to_home) {
        if (extend)
          return old_value; //already have beginning in list
        else
          return new_value.Add(object); //object is left assigned to first
      } else
        return Am_No_Value_List; //already at home, cannot go further
    }
    parts.Move_Nth(index - 1);
    if (extend) {
      new_value = old_value;
      if (to_home) {
        for (; !parts.First(); parts.Prev()) {
          object = parts.Get();
          new_value.Add(object);
        }
      } else
        new_value.Add(parts.Get()); //just add that one
    } else {                        //not extend
      new_value.Add(parts.Get());
    }
  } else { //no old_value
    parts.End();
    new_value.Add(parts.Get());
  }
  return new_value;
}